

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

void __thiscall ACSStringPool::UnlockStringArray(ACSStringPool *this,int *strnum,uint count)

{
  uint uVar1;
  uint uVar2;
  PoolEntry *pPVar3;
  uint local_20;
  int num;
  uint i;
  uint count_local;
  int *strnum_local;
  ACSStringPool *this_local;
  
  local_20 = 0;
  do {
    if (count <= local_20) {
      return;
    }
    if ((strnum[local_20] & 0xfff00000U) == 0x7ff00000) {
      uVar1 = strnum[local_20] & 0xfffff;
      uVar2 = TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry>::Size(&this->Pool);
      if (uVar1 < uVar2) {
        pPVar3 = TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry>::operator[]
                           (&this->Pool,(long)(int)uVar1);
        if (pPVar3->LockCount == 0) {
          __assert_fail("Pool[num].LockCount > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_acs.cpp"
                        ,0x204,"void ACSStringPool::UnlockStringArray(const int *, unsigned int)");
        }
        pPVar3 = TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry>::operator[]
                           (&this->Pool,(long)(int)uVar1);
        pPVar3->LockCount = pPVar3->LockCount - 1;
      }
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

void ACSStringPool::UnlockStringArray(const int *strnum, unsigned int count)
{
	for (unsigned int i = 0; i < count; ++i)
	{
		int num = strnum[i];
		if ((num & LIBRARYID_MASK) == STRPOOL_LIBRARYID_OR)
		{
			num &= ~LIBRARYID_MASK;
			if ((unsigned)num < Pool.Size())
			{
				assert(Pool[num].LockCount > 0);
				Pool[num].LockCount--;
			}
		}
	}
}